

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::evaluateBrand
          (BrandScope *this,Resolver *resolver,ResolvedDecl *decl,Reader brand,uint index)

{
  short sVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  Reader type;
  Reader brand_00;
  undefined1 uVar4;
  Refcounted *refcounted_1;
  _func_int *p_Var5;
  WirePointer *pWVar6;
  undefined8 *puVar7;
  undefined4 in_register_0000000c;
  uint64_t *puVar8;
  uint64_t uVar9;
  BrandScope *extraout_RDX;
  BrandScope *extraout_RDX_00;
  Refcounted *refcounted;
  kj *pkVar11;
  ElementCount index_00;
  uint in_R8D;
  _func_int *p_Var12;
  bool bVar13;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar14;
  ArrayPtr<capnp::compiler::BrandedDecl> content;
  ArrayBuilder<capnp::compiler::BrandedDecl> params;
  ResolvedDecl anyPointerDecl;
  Reader nextScope;
  Reader binding;
  Reader bindings;
  _func_int **local_328;
  _func_int *p_Stack_300;
  BrandedDecl local_2d8;
  StructReader local_228;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  StructReader local_1c8;
  undefined1 local_198 [39];
  undefined8 local_171;
  undefined8 uStack_169;
  BrandedDecl *local_158;
  BrandedDecl *pBStack_150;
  undefined1 local_148;
  undefined7 uStack_147;
  undefined1 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  StructReader local_c0;
  ListReader local_90;
  uint local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  BrandScope *pBVar10;
  
  puVar8 = (uint64_t *)CONCAT44(in_register_0000000c,index);
  pp_Var2 = resolver[2]._vptr_Resolver;
  local_328 = (_func_int **)operator_new(0x50);
  p_Var12 = (_func_int *)*puVar8;
  *local_328 = (_func_int *)&PTR_disposeImpl_006d66b0;
  local_328[2] = (_func_int *)pp_Var2;
  local_328[3] = (_func_int *)0x0;
  local_328[4] = (_func_int *)0x0;
  local_328[5] = p_Var12;
  *(undefined1 *)((long)local_328 + 0x34) = 0;
  local_328[7] = (_func_int *)0x0;
  local_328[8] = (_func_int *)0x0;
  local_328[9] = (_func_int *)0x0;
  *(undefined4 *)(local_328 + 1) = 1;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = local_328;
  *(_func_int ***)&(this->super_Refcounted).refcount = local_328;
  *(int *)(local_328 + 6) = (int)puVar8[1];
  if (in_R8D < brand.reader.elementCount) {
    capnp::_::ListReader::getStructElement(&local_228,&brand.reader,in_R8D);
    if (local_228.dataSize < 0x40) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(uint64_t *)CONCAT17(local_228.data._7_1_,local_228.data._0_7_);
    }
    if (*puVar8 == uVar9) {
      if ((local_228.dataSize < 0x50) ||
         (sVar1 = *(short *)(CONCAT17(local_228.data._7_1_,local_228.data._0_7_) + 8), sVar1 == 0))
      {
        bVar13 = local_228.pointerCount == 0;
        local_2d8.body.field_1._8_8_ = CONCAT17(local_228.pointers._7_1_,local_228.pointers._0_7_);
        if (bVar13) {
          local_2d8.body.field_1._8_8_ = 0;
        }
        local_2d8.body.field_1._16_4_ = 0x7fffffff;
        if (!bVar13) {
          local_2d8.body.field_1._16_4_ = local_228.nestingLimit;
        }
        local_2d8.body.tag = 0;
        local_2d8.body._4_4_ = 0;
        local_2d8.body.field_1._0_4_ = 0;
        local_2d8.body.field_1._4_4_ = 0;
        if (!bVar13) {
          local_2d8.body.tag = (uint)local_228.segment;
          local_2d8.body._4_4_ = local_228.segment._4_4_;
          local_2d8.body.field_1._0_4_ = local_228.capTable._0_4_;
          local_2d8.body.field_1._4_4_ = local_228.capTable._4_4_;
        }
        capnp::_::PointerReader::getList
                  (&local_90,(PointerReader *)&local_2d8,INLINE_COMPOSITE,(word *)0x0);
        p_Var5 = (_func_int *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0xa8,0,(ulong)local_90.elementCount,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
        p_Var12 = p_Var5;
        if (local_90.elementCount != 0) {
          index_00 = 0;
          p_Stack_300 = p_Var5;
          do {
            capnp::_::ListReader::getStructElement(&local_1c8,&local_90,index_00);
            if ((local_1c8.dataSize < 0x10) || (*local_1c8.data == 0)) {
              (**(code **)(decl->id + 0x10))(&local_2d8,decl,0x1e);
              uVar4 = local_2d8.body.field_1.space[0x20];
              if ((code)local_2d8.body.field_1.space[0x20] == (code)0x1) {
                local_f8 = CONCAT71(local_2d8.body.field_1._41_7_,local_2d8.body.field_1.space[0x28]
                                   );
                local_d8 = local_2d8.body.field_1._72_8_;
                uStack_d0 = local_2d8.body.field_1._80_8_;
                local_e8 = local_2d8.body.field_1._56_8_;
                uStack_e0 = local_2d8.body.field_1._64_8_;
                uStack_f0 = local_2d8.body.field_1._48_8_;
              }
              pp_Var2 = resolver[2]._vptr_Resolver;
              puVar7 = (undefined8 *)operator_new(0x50);
              *puVar7 = &PTR_disposeImpl_006d66b0;
              puVar7[2] = pp_Var2;
              puVar7[3] = 0;
              puVar7[4] = 0;
              puVar7[5] = local_2d8.body.field_1._8_8_;
              *(undefined4 *)(puVar7 + 6) = 0;
              *(undefined1 *)((long)puVar7 + 0x34) = 0;
              puVar7[7] = 0;
              puVar7[8] = 0;
              puVar7[9] = 0;
              *(undefined4 *)(puVar7 + 1) = 1;
              local_1d8 = 0;
              local_1e8 = 0;
              uStack_1e0 = 0;
              local_1f8 = 0;
              uStack_1f0 = 0;
              local_38 = local_2d8.body.field_1._24_8_;
              uStack_40 = CONCAT44(local_2d8.body.field_1._20_4_,local_2d8.body.field_1._16_4_);
              local_48 = local_2d8.body.field_1._8_8_;
              local_58 = local_2d8.body.tag;
              uStack_54 = local_2d8.body._4_4_;
              uStack_50 = local_2d8.body.field_1._0_8_;
              if ((code)uVar4 == (code)0x0) {
                *(undefined4 *)p_Var12 = 1;
                *(undefined8 *)(p_Var12 + 8) = local_2d8.body._0_8_;
                *(undefined8 *)(p_Var12 + 0x10) = local_2d8.body.field_1._0_8_;
                *(undefined8 *)(p_Var12 + 0x18) = local_2d8.body.field_1._8_8_;
                *(undefined8 *)(p_Var12 + 0x20) = uStack_40;
                *(undefined8 *)(p_Var12 + 0x28) = local_2d8.body.field_1._24_8_;
                p_Var12[0x30] = (code)0x0;
              }
              else {
                local_171 = local_d8;
                uStack_169 = uStack_d0;
                local_198[0x17] = (undefined1)local_e8;
                local_198._24_4_ = (undefined4)((ulong)local_e8 >> 8);
                local_198._28_3_ = (undefined3)((ulong)local_e8 >> 0x28);
                local_198._31_8_ = uStack_e0;
                local_198[7] = (undefined1)local_f8;
                local_198._8_4_ = (undefined4)((ulong)local_f8 >> 8);
                local_198._12_3_ = (undefined3)((ulong)local_f8 >> 0x28);
                local_198[0xf] = (undefined1)uStack_f0;
                local_198._16_7_ = (undefined7)((ulong)uStack_f0 >> 8);
                *(undefined4 *)p_Var12 = 1;
                *(undefined8 *)(p_Var12 + 8) = local_2d8.body._0_8_;
                *(undefined8 *)(p_Var12 + 0x10) = local_2d8.body.field_1._0_8_;
                *(undefined8 *)(p_Var12 + 0x18) = local_2d8.body.field_1._8_8_;
                *(undefined8 *)(p_Var12 + 0x20) = uStack_40;
                *(undefined8 *)(p_Var12 + 0x28) = local_2d8.body.field_1._24_8_;
                p_Var12[0x30] = (_func_int)uVar4;
                *(undefined8 *)(p_Var12 + 0x38) = local_f8;
                *(undefined8 *)(p_Var12 + 0x40) = uStack_f0;
                *(undefined8 *)(p_Var12 + 0x48) = local_e8;
                *(undefined8 *)(p_Var12 + 0x50) = uStack_e0;
                *(undefined8 *)(p_Var12 + 0x58) = local_d8;
                *(undefined8 *)(p_Var12 + 0x60) = uStack_d0;
              }
              *(undefined8 **)(p_Var12 + 0x68) = puVar7;
              *(undefined8 **)(p_Var12 + 0x70) = puVar7;
              *(undefined8 *)(p_Var12 + 0x78) = 0;
              *(undefined8 *)(p_Var12 + 0x80) = 0;
              *(undefined8 *)(p_Var12 + 0x88) = 0;
              *(undefined8 *)(p_Var12 + 0x90) = 0;
              *(undefined8 *)(p_Var12 + 0x98) = 0;
              *(undefined8 *)(p_Var12 + 0xa0) = 0x7fffffff;
              p_Var12 = p_Var12 + 0xa8;
              p_Stack_300 = p_Var12;
            }
            else if (*local_1c8.data == 1) {
              local_198._24_4_ = local_1c8.nestingLimit;
              pWVar6 = local_1c8.pointers;
              if (local_1c8.pointerCount == 0) {
                pWVar6 = (WirePointer *)0x0;
                local_198._24_4_ = 0x7fffffff;
              }
              local_198._0_4_ = 0;
              local_198._4_4_ = 0;
              local_198._8_4_ = 0;
              local_198._12_4_ = 0;
              if (local_1c8.pointerCount != 0) {
                local_198._0_4_ = local_1c8.segment._0_4_;
                local_198._4_4_ = local_1c8.segment._4_4_;
                local_198._8_4_ = local_1c8.capTable._0_4_;
                local_198._12_4_ = local_1c8.capTable._4_4_;
              }
              local_198._16_7_ = SUB87(pWVar6,0);
              local_198[0x17] = (undefined1)((ulong)pWVar6 >> 0x38);
              capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)local_198,(word *)0x0);
              type._reader.capTable = local_c0.capTable;
              type._reader.segment = local_c0.segment;
              type._reader.data = local_c0.data;
              type._reader.pointers = local_c0.pointers;
              type._reader.dataSize = local_c0.dataSize;
              type._reader.pointerCount = local_c0.pointerCount;
              type._reader._38_2_ = local_c0._38_2_;
              type._reader.nestingLimit = local_c0.nestingLimit;
              type._reader._44_4_ = local_c0._44_4_;
              decompileType(&local_2d8,(BrandScope *)resolver,(Resolver *)decl,type);
              *(uint *)p_Var12 = local_2d8.body.tag;
              if (local_2d8.body.tag == 2) {
                *(undefined8 *)(p_Var12 + 8) = local_2d8.body.field_1._0_8_;
                *(undefined8 *)(p_Var12 + 0x10) = local_2d8.body.field_1._8_8_;
              }
              else {
                p_Stack_300 = p_Var12;
                if (local_2d8.body.tag == 1) {
                  *(ulong *)(p_Var12 + 0x28) =
                       CONCAT71(local_2d8.body.field_1._33_7_,local_2d8.body.field_1.space[0x20]);
                  *(ulong *)(p_Var12 + 0x18) =
                       CONCAT44(local_2d8.body.field_1._20_4_,local_2d8.body.field_1._16_4_);
                  *(undefined8 *)(p_Var12 + 0x20) = local_2d8.body.field_1._24_8_;
                  *(undefined8 *)(p_Var12 + 8) = local_2d8.body.field_1._0_8_;
                  *(undefined8 *)(p_Var12 + 0x10) = local_2d8.body.field_1._8_8_;
                  p_Var12[0x30] = (_func_int)local_2d8.body.field_1.space[0x28];
                  if ((code)local_2d8.body.field_1.space[0x28] == (code)0x1) {
                    *(undefined8 *)(p_Var12 + 0x58) = local_2d8.body.field_1._80_8_;
                    *(undefined8 *)(p_Var12 + 0x60) = local_2d8.body.field_1._88_8_;
                    *(undefined8 *)(p_Var12 + 0x48) = local_2d8.body.field_1._64_8_;
                    *(undefined8 *)(p_Var12 + 0x50) = local_2d8.body.field_1._72_8_;
                    *(undefined8 *)(p_Var12 + 0x38) = local_2d8.body.field_1._48_8_;
                    *(undefined8 *)(p_Var12 + 0x40) = local_2d8.body.field_1._56_8_;
                    local_2d8.body.field_1.space[0x28] = '\0';
                  }
                }
              }
              *(Disposer **)(p_Var12 + 0x68) = local_2d8.brand.disposer;
              *(BrandScope **)(p_Var12 + 0x70) = local_2d8.brand.ptr;
              local_2d8.brand.ptr = (BrandScope *)0x0;
              *(undefined8 *)(p_Var12 + 0x98) = local_2d8.source._reader._32_8_;
              *(undefined8 *)(p_Var12 + 0xa0) = local_2d8.source._reader._40_8_;
              *(void **)(p_Var12 + 0x88) = local_2d8.source._reader.data;
              *(WirePointer **)(p_Var12 + 0x90) = local_2d8.source._reader.pointers;
              *(SegmentReader **)(p_Var12 + 0x78) = local_2d8.source._reader.segment;
              *(CapTableReader **)(p_Var12 + 0x80) = local_2d8.source._reader.capTable;
              p_Var12 = p_Stack_300 + 0xa8;
              p_Stack_300 = p_Var12;
            }
            index_00 = index_00 + 1;
          } while (local_90.elementCount != index_00);
          local_328 = *(_func_int ***)&(this->super_Refcounted).refcount;
        }
        local_2d8.body.field_1._8_8_ = &kj::_::HeapArrayDisposer::instance;
        pkVar11 = (kj *)(((long)p_Var12 - (long)p_Var5 >> 3) * -0x30c30c30c30c30c3);
        p_Var12 = local_328[7];
        local_2d8.body._0_8_ = p_Var5;
        local_2d8.body.field_1._0_8_ = pkVar11;
        if (p_Var12 != (_func_int *)0x0) {
          p_Var3 = local_328[8];
          local_328[7] = (_func_int *)0x0;
          local_328[8] = (_func_int *)0x0;
          (*(code *)**(undefined8 **)local_328[9])
                    (local_328[9],p_Var12,0xa8,p_Var3,p_Var3,
                     kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
        }
        local_328[7] = p_Var5;
        local_328[8] = (_func_int *)pkVar11;
        local_328[9] = (_func_int *)&kj::_::HeapArrayDisposer::instance;
      }
      else if (sVar1 == 1) {
        getParams((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&local_2d8,
                  (BrandScope *)resolver,*puVar8);
        if ((char)local_2d8.body.tag == '\x01') {
          content.size_ = uVar9;
          content.ptr = (BrandedDecl *)local_2d8.body.field_1._8_8_;
          kj::heapArray<capnp::compiler::BrandedDecl>
                    ((Array<capnp::compiler::BrandedDecl> *)&local_2d8,
                     (kj *)local_2d8.body.field_1._0_8_,content);
          p_Var12 = local_328[7];
          if (p_Var12 != (_func_int *)0x0) {
            p_Var5 = local_328[8];
            local_328[7] = (_func_int *)0x0;
            local_328[8] = (_func_int *)0x0;
            (*(code *)**(undefined8 **)local_328[9])
                      (local_328[9],p_Var12,0xa8,p_Var5,p_Var5,
                       kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
          }
          local_328[7] = (_func_int *)local_2d8.body._0_8_;
          local_328[8] = (_func_int *)local_2d8.body.field_1._0_8_;
          local_328[9] = (_func_int *)local_2d8.body.field_1._8_8_;
        }
        else {
          *(undefined1 *)((long)local_328 + 0x34) = 1;
        }
      }
    }
  }
  (**(code **)(*(long *)puVar8[4] + 0x20))(&local_2d8);
  pBVar10 = extraout_RDX;
  if ((char)local_2d8.body.tag == '\x01') {
    local_228.data._7_1_ = (undefined1)local_2d8.body.field_1._16_4_;
    local_228.pointers._0_7_ =
         (undefined7)(CONCAT44(local_2d8.body.field_1._20_4_,local_2d8.body.field_1._16_4_) >> 8);
    local_228.pointers._7_1_ = (undefined1)local_2d8.body.field_1._24_8_;
    local_228.dataSize = (StructDataBitCount)((ulong)local_2d8.body.field_1._24_8_ >> 8);
    local_228.pointerCount = (StructPointerCount)((ulong)local_2d8.body.field_1._24_8_ >> 0x28);
    local_228._38_1_ = SUB81((ulong)local_2d8.body.field_1._24_8_ >> 0x38,0);
    local_228.segment._7_1_ = (undefined1)local_2d8.body.field_1._0_8_;
    local_228.capTable._0_4_ = (undefined4)((ulong)local_2d8.body.field_1._0_8_ >> 8);
    local_228.capTable._4_3_ = (undefined3)((ulong)local_2d8.body.field_1._0_8_ >> 0x28);
    local_228.capTable._7_1_ = (undefined1)local_2d8.body.field_1._8_8_;
    local_228.data._0_7_ = (undefined7)((ulong)local_2d8.body.field_1._8_8_ >> 8);
    if ((code)local_2d8.body.field_1.space[0x28] != (code)0x0) {
      local_171 = local_2d8.body.field_1._80_8_;
      uStack_169 = local_2d8.body.field_1._88_8_;
      local_198[0x17] = (undefined1)local_2d8.body.field_1._64_8_;
      local_198._24_4_ = (undefined4)((ulong)local_2d8.body.field_1._64_8_ >> 8);
      local_198._28_3_ = (undefined3)((ulong)local_2d8.body.field_1._64_8_ >> 0x28);
      local_198._31_8_ = local_2d8.body.field_1._72_8_;
      local_198[7] = (undefined1)local_2d8.body.field_1._48_8_;
      local_198._8_4_ = (undefined4)((ulong)local_2d8.body.field_1._48_8_ >> 8);
      local_198._12_3_ = (undefined3)((ulong)local_2d8.body.field_1._48_8_ >> 0x28);
      local_198[0xf] = (undefined1)local_2d8.body.field_1._56_8_;
      local_198._16_7_ = (undefined7)((ulong)local_2d8.body.field_1._56_8_ >> 8);
      local_128 = local_2d8.body.field_1._48_8_;
      uStack_120 = local_2d8.body.field_1._56_8_;
      local_118 = local_2d8.body.field_1._64_8_;
      uStack_110 = local_2d8.body.field_1._72_8_;
      local_108 = local_2d8.body.field_1._80_8_;
      uStack_100 = local_2d8.body.field_1._88_8_;
    }
    _local_148 = CONCAT71(local_228.pointers._0_7_,local_228.data._7_1_);
    pBStack_150 = (BrandedDecl *)local_2d8.body.field_1._8_8_;
    local_158 = (BrandedDecl *)local_2d8.body.field_1._0_8_;
    local_130 = (code)local_2d8.body.field_1.space[0x28];
    brand_00.reader.step = brand.reader.step;
    brand_00.reader.elementCount = brand.reader.elementCount;
    brand_00.reader.capTable = brand.reader.capTable;
    brand_00.reader.segment = brand.reader.segment;
    brand_00.reader.ptr = brand.reader.ptr;
    brand_00.reader.structDataSize = brand.reader.structDataSize;
    brand_00.reader.structPointerCount = brand.reader.structPointerCount;
    brand_00.reader.elementSize = brand.reader.elementSize;
    brand_00.reader._39_1_ = brand.reader._39_1_;
    brand_00.reader.nestingLimit = brand.reader.nestingLimit;
    brand_00.reader._44_4_ = brand.reader._44_4_;
    OVar14 = evaluateBrand((BrandScope *)&local_2d8,resolver,decl,brand_00,(uint)&local_158);
    pBVar10 = OVar14.ptr;
    p_Var12 = local_328[3];
    p_Var5 = local_328[4];
    *(uint *)(local_328 + 3) = local_2d8.body.tag;
    *(undefined4 *)((long)local_328 + 0x1c) = local_2d8.body._4_4_;
    *(undefined4 *)(local_328 + 4) = local_2d8.body.field_1._0_4_;
    *(undefined4 *)((long)local_328 + 0x24) = local_2d8.body.field_1._4_4_;
    if (p_Var5 != (_func_int *)0x0) {
      (*(code *)**(undefined8 **)p_Var12)(p_Var12,p_Var5 + *(long *)(*(long *)p_Var5 + -0x10));
      pBVar10 = extraout_RDX_00;
    }
  }
  OVar14.ptr = pBVar10;
  OVar14.disposer = (Disposer *)this;
  return OVar14;
}

Assistant:

kj::Own<BrandScope> BrandScope::evaluateBrand(
    Resolver& resolver, Resolver::ResolvedDecl decl,
    List<schema::Brand::Scope>::Reader brand, uint index) {
  auto result = kj::refcounted<BrandScope>(errorReporter, decl.id);
  result->leafParamCount = decl.genericParamCount;

  // Fill in `params`.
  if (index < brand.size()) {
    auto nextScope = brand[index];
    if (decl.id == nextScope.getScopeId()) {
      // Initialize our parameters.

      switch (nextScope.which()) {
        case schema::Brand::Scope::BIND: {
          auto bindings = nextScope.getBind();
          auto params = kj::heapArrayBuilder<BrandedDecl>(bindings.size());
          for (auto binding: bindings) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND: {
                // Build an AnyPointer-equivalent.
                auto anyPointerDecl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
                params.add(BrandedDecl(anyPointerDecl,
                    kj::refcounted<BrandScope>(errorReporter, anyPointerDecl.scopeId),
                    Expression::Reader()));
                break;
              }

              case schema::Brand::Binding::TYPE:
                // Reverse this schema::Type back into a BrandedDecl.
                params.add(decompileType(resolver, binding.getType()));
                break;
            }
          }
          result->params = params.finish();
          break;
        }

        case schema::Brand::Scope::INHERIT:
          KJ_IF_SOME(p, getParams(decl.id)) {
            result->params = kj::heapArray(p);
          } else {
            result->inherited = true;
          }
          break;
      }

      // Parent should start one level deeper in the list.
      ++index;
    }
  }